

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O3

llb_build_key_t * llb_build_key_make_custom_task(char *name,char *taskData)

{
  CAPIBuildKey *this;
  size_t sVar1;
  StringRef name_00;
  BuildKey local_50;
  StringRef local_30;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  if (name == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(name);
  }
  if (taskData == (char *)0x0) {
    local_30.Length = 0;
  }
  else {
    local_30.Length = strlen(taskData);
  }
  name_00.Length = sVar1;
  name_00.Data = name;
  local_30.Data = taskData;
  llbuild::buildsystem::BuildKey::BuildKey<llvm::StringRef>(&local_50,'X',name_00,&local_30);
  anon_unknown.dwarf_2bd53f::CAPIBuildKey::CAPIBuildKey(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
    operator_delete(local_50.key.key._M_dataplus._M_p,
                    local_50.key.key.field_2._M_allocated_capacity + 1);
  }
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_custom_task(const char *name, const char *taskData) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeCustomTask(StringRef(name), StringRef(taskData)));
}